

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsview.cpp
# Opt level: O1

void __thiscall QGraphicsView::mouseReleaseEvent(QGraphicsView *this,QMouseEvent *event)

{
  QEventStorage<QMouseEvent> *this_00;
  uint uVar1;
  QGraphicsViewPrivate *this_01;
  Data *pDVar2;
  QPointF QVar3;
  bool bVar4;
  MouseEventSource source;
  MouseEventFlags flags;
  QFlagsStorage<Qt::MouseButton> QVar5;
  QWidget *pQVar6;
  QObject *pQVar7;
  long in_FS_OFFSET;
  double dVar8;
  double dVar9;
  double in_XMM1_Qa;
  double dVar10;
  QPoint local_70;
  QPointF local_68;
  undefined1 local_58 [12];
  char cStack_4c;
  undefined3 uStack_4b;
  QScopedPointer<QGraphicsSceneEventPrivate,_QScopedPointerDeleter<QGraphicsSceneEventPrivate>_>
  local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_01 = *(QGraphicsViewPrivate **)(this + 8);
  if (this_01->dragMode == ScrollHandDrag) {
    if (*(int *)(event + 0x40) == 1) {
      pQVar6 = QAbstractScrollArea::viewport((QAbstractScrollArea *)this);
      QCursor::QCursor((QCursor *)local_58,OpenHandCursor);
      QWidget::setCursor(pQVar6,(QCursor *)local_58);
      QCursor::~QCursor((QCursor *)local_58);
      uVar1 = *(uint *)&this_01->field_0x300;
      *(uint *)&this_01->field_0x300 = uVar1 & 0xfffffdff;
      pDVar2 = (this_01->scene).wp.d;
      if (((pDVar2 != (Data *)0x0) && (*(int *)(pDVar2 + 4) != 0)) &&
         (((uVar1 & 1) != 0 && (this_01->scene).wp.value != (QObject *)0x0 &&
          (((this_01->lastMouseEvent).field_0.field2[0xc] == '\0' &&
           (this_01->handScrollMotions < 7)))))) {
        QGraphicsScene::clearSelection((QGraphicsScene *)(this_01->scene).wp.value);
      }
    }
  }
  else if (((this_01->dragMode == RubberBandDrag) && ((this_01->field_0x300 & 1) != 0)) &&
          (*(int *)(event + 0x44) == 0)) {
    QGraphicsViewPrivate::clearRubberBand(this_01);
  }
  this_01->field_0x300 = this_01->field_0x300 | 8;
  this_00 = &this_01->lastMouseEvent;
  if ((this_00 != (QEventStorage<QMouseEvent> *)event) ||
     ((this_01->lastMouseEvent).m_engaged == false)) {
    QEventStorage<QMouseEvent>::store(this_00,event);
  }
  if (((((this_01->field_0x300 & 1) != 0) && (pDVar2 = (this_01->scene).wp.d, pDVar2 != (Data *)0x0)
       ) && (*(int *)(pDVar2 + 4) != 0)) && ((this_01->scene).wp.value != (QObject *)0x0)) {
    local_48.d = (QGraphicsSceneEventPrivate *)&DAT_aaaaaaaaaaaaaaaa;
    local_58._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    stack0xffffffffffffffb0 = &DAT_aaaaaaaaaaaaaaaa;
    QGraphicsSceneMouseEvent::QGraphicsSceneMouseEvent
              ((QGraphicsSceneMouseEvent *)local_58,GraphicsSceneMouseRelease);
    pQVar6 = QAbstractScrollArea::viewport((QAbstractScrollArea *)this);
    QGraphicsSceneEvent::setWidget((QGraphicsSceneEvent *)local_58,pQVar6);
    QGraphicsSceneMouseEvent::setButtonDownScenePos
              ((QGraphicsSceneMouseEvent *)local_58,this_01->mousePressButton,
               &this_01->mousePressScenePoint);
    QGraphicsSceneMouseEvent::setButtonDownScreenPos
              ((QGraphicsSceneMouseEvent *)local_58,this_01->mousePressButton,
               &this_01->mousePressScreenPoint);
    dVar8 = (double)QEventPoint::position();
    dVar8 = (double)((ulong)dVar8 & 0x8000000000000000 | 0x3fe0000000000000) + dVar8;
    dVar10 = 2147483647.0;
    if (dVar8 <= 2147483647.0) {
      dVar10 = dVar8;
    }
    if (dVar10 <= -2147483648.0) {
      dVar10 = -2147483648.0;
    }
    local_70.xp.m_i = (int)dVar10;
    in_XMM1_Qa = (double)((ulong)in_XMM1_Qa & 0x8000000000000000 | 0x3fe0000000000000) + in_XMM1_Qa;
    dVar10 = 2147483647.0;
    if (in_XMM1_Qa <= 2147483647.0) {
      dVar10 = in_XMM1_Qa;
    }
    if (dVar10 <= -2147483648.0) {
      dVar10 = -2147483648.0;
    }
    local_70.yp.m_i = (int)dVar10;
    local_68 = mapToScene(this,&local_70);
    dVar9 = local_68.yp;
    QGraphicsSceneMouseEvent::setScenePos((QGraphicsSceneMouseEvent *)local_58,&local_68);
    dVar8 = (double)QEventPoint::globalPosition();
    QVar3 = local_68;
    dVar8 = (double)((ulong)dVar8 & 0x8000000000000000 | 0x3fe0000000000000) + dVar8;
    dVar10 = 2147483647.0;
    if (dVar8 <= 2147483647.0) {
      dVar10 = dVar8;
    }
    if (dVar10 <= -2147483648.0) {
      dVar10 = -2147483648.0;
    }
    dVar9 = (double)((ulong)dVar9 & 0x8000000000000000 | 0x3fe0000000000000) + dVar9;
    dVar8 = 2147483647.0;
    if (dVar9 <= 2147483647.0) {
      dVar8 = dVar9;
    }
    if (dVar8 <= -2147483648.0) {
      dVar8 = -2147483648.0;
    }
    local_68.xp._4_4_ = (int)dVar8;
    local_68.xp._0_4_ = (int)dVar10;
    local_68.yp = QVar3.yp;
    QGraphicsSceneMouseEvent::setScreenPos((QGraphicsSceneMouseEvent *)local_58,(QPoint *)&local_68)
    ;
    QGraphicsSceneMouseEvent::setLastScenePos
              ((QGraphicsSceneMouseEvent *)local_58,&this_01->lastMouseMoveScenePoint);
    QGraphicsSceneMouseEvent::setLastScreenPos
              ((QGraphicsSceneMouseEvent *)local_58,&this_01->lastMouseMoveScreenPoint);
    QGraphicsSceneMouseEvent::setButtons
              ((QGraphicsSceneMouseEvent *)local_58,
               (QFlagsStorageHelper<Qt::MouseButton,_4>)
               *(QFlagsStorage<Qt::MouseButton> *)(event + 0x44));
    QGraphicsSceneMouseEvent::setButton
              ((QGraphicsSceneMouseEvent *)local_58,*(MouseButton *)(event + 0x40));
    QGraphicsSceneMouseEvent::setModifiers
              ((QGraphicsSceneMouseEvent *)local_58,
               (QFlagsStorageHelper<Qt::KeyboardModifier,_4>)
               *(QFlagsStorage<Qt::KeyboardModifier> *)(event + 0x20));
    source = QMouseEvent::source();
    QGraphicsSceneMouseEvent::setSource((QGraphicsSceneMouseEvent *)local_58,source);
    flags.super_QFlagsStorageHelper<Qt::MouseEventFlag,_4>.super_QFlagsStorage<Qt::MouseEventFlag>.i
         = (QFlagsStorageHelper<Qt::MouseEventFlag,_4>)QMouseEvent::flags();
    QGraphicsSceneMouseEvent::setFlags((QGraphicsSceneMouseEvent *)local_58,flags);
    cStack_4c = 0;
    QGraphicsSceneEvent::setTimestamp((QGraphicsSceneEvent *)local_58,*(quint64 *)(event + 0x18));
    pDVar2 = (this_01->scene).wp.d;
    if (event[0xb] == (QMouseEvent)0x1) {
      if ((pDVar2 == (Data *)0x0) || (*(int *)(pDVar2 + 4) == 0)) {
        pQVar7 = (QObject *)0x0;
      }
      else {
        pQVar7 = (this_01->scene).wp.value;
      }
      qt_sendSpontaneousEvent(pQVar7,(QEvent *)local_58);
    }
    else {
      if ((pDVar2 == (Data *)0x0) || (*(int *)(pDVar2 + 4) == 0)) {
        pQVar7 = (QObject *)0x0;
      }
      else {
        pQVar7 = (this_01->scene).wp.value;
      }
      QCoreApplication::sendEvent(pQVar7,(QEvent *)local_58);
    }
    (**(code **)(*(long *)&this_00->field_0 + 0x10))(this_00,cStack_4c);
    (**(code **)(*(long *)event + 0x10))(event,cStack_4c);
    if ((cStack_4c == '\x01') &&
       (QVar5.i = (Int)QGraphicsSceneMouseEvent::buttons((QGraphicsSceneMouseEvent *)local_58),
       (QFlagsStorage<Qt::MouseButton>)QVar5.i == (QFlagsStorage<Qt::MouseButton>)0x0)) {
      pQVar6 = QAbstractScrollArea::viewport((QAbstractScrollArea *)this);
      bVar4 = QWidget::testAttribute_helper(pQVar6,WA_SetCursor);
      if (bVar4) {
        QGraphicsViewPrivate::_q_unsetViewportCursor(this_01);
      }
    }
    QGraphicsSceneHelpEvent::~QGraphicsSceneHelpEvent((QGraphicsSceneHelpEvent *)local_58);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsView::mouseReleaseEvent(QMouseEvent *event)
{
    Q_D(QGraphicsView);

#if QT_CONFIG(rubberband)
    if (d->dragMode == QGraphicsView::RubberBandDrag && d->sceneInteractionAllowed && !event->buttons()) {
        d->clearRubberBand();
    } else
#endif
    if (d->dragMode == QGraphicsView::ScrollHandDrag && event->button() == Qt::LeftButton) {
#ifndef QT_NO_CURSOR
        // Restore the open hand cursor. ### There might be items
        // under the mouse that have a valid cursor at this time, so
        // we could repeat the steps from mouseMoveEvent().
        viewport()->setCursor(Qt::OpenHandCursor);
#endif
        d->handScrolling = false;

        if (d->scene && d->sceneInteractionAllowed && !d->lastMouseEvent->isAccepted() && d->handScrollMotions <= 6) {
            // If we've detected very little motion during the hand drag, and
            // no item accepted the last event, we'll interpret that as a
            // click to the scene, and reset the selection.
            d->scene->clearSelection();
        }
    }

    d->storeMouseEvent(event);

    if (!d->sceneInteractionAllowed)
        return;

    if (!d->scene)
        return;

    QGraphicsSceneMouseEvent mouseEvent(QEvent::GraphicsSceneMouseRelease);
    mouseEvent.setWidget(viewport());
    mouseEvent.setButtonDownScenePos(d->mousePressButton, d->mousePressScenePoint);
    mouseEvent.setButtonDownScreenPos(d->mousePressButton, d->mousePressScreenPoint);
    mouseEvent.setScenePos(mapToScene(event->position().toPoint()));
    mouseEvent.setScreenPos(event->globalPosition().toPoint());
    mouseEvent.setLastScenePos(d->lastMouseMoveScenePoint);
    mouseEvent.setLastScreenPos(d->lastMouseMoveScreenPoint);
    mouseEvent.setButtons(event->buttons());
    mouseEvent.setButton(event->button());
    mouseEvent.setModifiers(event->modifiers());
    mouseEvent.setSource(event->source());
    mouseEvent.setFlags(event->flags());
    mouseEvent.setAccepted(false);
    mouseEvent.setTimestamp(event->timestamp());
    if (event->spontaneous())
        qt_sendSpontaneousEvent(d->scene, &mouseEvent);
    else
        QCoreApplication::sendEvent(d->scene, &mouseEvent);

    // Update the last and current mouse events' accepted state.
    d->lastMouseEvent->setAccepted(mouseEvent.isAccepted());
    event->setAccepted(mouseEvent.isAccepted());

#ifndef QT_NO_CURSOR
    if (mouseEvent.isAccepted() && mouseEvent.buttons() == 0 && viewport()->testAttribute(Qt::WA_SetCursor)) {
        // The last mouse release on the viewport will trigger clearing the cursor.
        d->_q_unsetViewportCursor();
    }
#endif
}